

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_4::Validator::OnBrOnExnExpr(Validator *this,BrOnExnExpr *expr)

{
  Result RVar1;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_78,&expr->label_var);
  Var::Var(&local_c0,&expr->event_var);
  RVar1 = SharedValidator::OnBrOnExn
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)10>).super_Expr.loc,
                     &local_78,&local_c0);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnBrOnExnExpr(BrOnExnExpr* expr) {
  result_ |= validator_.OnBrOnExn(expr->loc, expr->label_var,
                                  expr->event_var);
  return Result::Ok;
}